

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateBubbleText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,Channel *channel,
          DisplayBase display_base)

{
  U8 bitSize;
  char local_1b8 [8];
  char buf [256];
  char blueString [16];
  char greenString [16];
  char redString [16];
  char local_77 [3];
  int colorNumericBufferLength;
  char webBuf [8];
  U8 webColor [3];
  RGBValue local_5c;
  RGBValue rgb;
  U32 ledIndex;
  Frame frame;
  U64 local_40;
  RGBValue local_38 [3];
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  AsyncRgbLedAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&rgb.blue);
  rgb._0_4_ = local_38[0]._0_4_;
  local_5c = RGBValue::CreateFromU64(local_40);
  bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
  RGBValue::ConvertTo8Bit(&local_5c,bitSize,(U8 *)webBuf);
  snprintf(local_77,8,"#%02x%02x%02x",(ulong)(byte)webBuf[0],(ulong)(byte)webBuf[1],
           (ulong)(byte)webBuf[2]);
  GenerateRGBStrings(this,&local_5c,display_base,0x10,greenString + 8,blueString + 8,buf + 0xf8);
  snprintf(local_1b8,0x100,"LED %d Red: %s Green: %s Blue: %s %s",(ulong)(uint)rgb._0_4_,
           greenString + 8,blueString + 8,buf + 0xf8,local_77);
  AnalyzerResults::AddResultString
            ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  snprintf(local_1b8,0x100,"%d R: %s G: %s B: %s %s",(ulong)(uint)rgb._0_4_,greenString + 8,
           blueString + 8,buf + 0xf8,local_77);
  AnalyzerResults::AddResultString
            ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  snprintf(local_1b8,0x100,"(%d) %s",(ulong)(uint)rgb._0_4_,local_77);
  AnalyzerResults::AddResultString
            ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  AnalyzerResults::AddResultString
            ((char *)this,local_77,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)&rgb.blue);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    U32 ledIndex = frame.mData2;
    RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    // generate a Web/CSS representation of the color value
    U8 webColor[ 3 ];
    rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
    char webBuf[ 8 ];
    ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

    const int colorNumericBufferLength = 16;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // generate four different string variants of varying length, starting with
    // the longest and decreasing in size
    char buf[ 256 ];

    // example: LED: 13 Red: 0x1A Green: 0x2B Blue: 0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "LED %d Red: %s Green: %s Blue: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: 13 R:0x1A G:0x2B B:0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "%d R: %s G: %s B: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: (13) #1A2B3C
    ::snprintf( buf, sizeof( buf ), "(%d) %s", ledIndex, webBuf );
    AddResultString( buf );

    // example: #1A2B3C
    AddResultString( webBuf );
}